

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void idx2::Resize<unsigned_long>(array<unsigned_long> *Array,i64 NewSize)

{
  unsigned_long local_30;
  i64 local_28;
  i64 NewSize_local;
  array<unsigned_long> *Array_local;
  i64 local_10;
  
  local_28 = NewSize;
  NewSize_local = (i64)Array;
  if (Array->Capacity < NewSize) {
    GrowCapacity<unsigned_long>(Array,NewSize);
  }
  if (*(long *)(NewSize_local + 0x18) < local_28) {
    local_10 = NewSize_local;
    Array_local = (array<unsigned_long> *)NewSize_local;
    local_30 = 0;
    Fill<unsigned_long*,unsigned_long>
              ((unsigned_long *)(*(long *)NewSize_local + *(long *)(NewSize_local + 0x18) * 8),
               (unsigned_long *)(*(long *)NewSize_local + local_28 * 8),&local_30);
  }
  *(i64 *)(NewSize_local + 0x18) = local_28;
  return;
}

Assistant:

void
Resize(array<t>* Array, i64 NewSize)
{
  if (NewSize > Array->Capacity) // TODO: maybe grow the capacity until this is false
    GrowCapacity(Array, NewSize);
  if (Array->Size < NewSize)
    Fill(Begin(*Array) + Array->Size, Begin(*Array) + NewSize, t{});
  Array->Size = NewSize;
}